

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O1

int do_naming(obj *obj)

{
  nh_menuitem *pnVar1;
  boolean bVar2;
  char cVar3;
  char c;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  void *pvVar8;
  char *planA;
  size_t sVar9;
  char *last_resort;
  char *pcVar10;
  int selected [1];
  char buf [256];
  char title [128];
  char qbuf [128];
  menulist local_240;
  short local_22e;
  int local_22c;
  char local_228 [256];
  char local_128 [128];
  char local_a8 [128];
  
  init_menulist(&local_240);
  if (obj == (obj *)0x0) {
    builtin_strncpy(local_128 + 0x10," to name?",10);
    builtin_strncpy(local_128,"What do you wish",0x10);
    lVar7 = (long)local_240.size;
    if (local_240.size <= local_240.icount) {
      local_240.size = local_240.size * 2;
      local_240.items = (nh_menuitem *)realloc(local_240.items,lVar7 * 0x218);
    }
    lVar7 = (long)local_240.icount;
    local_240.items[lVar7].id = 1;
    local_240.items[lVar7].role = MI_NORMAL;
    local_240.items[lVar7].accel = 'C';
    local_240.items[lVar7].group_accel = '\0';
    local_240.items[lVar7].selected = '\0';
    builtin_strncpy(local_240.items[lVar7].caption,"Name a m",8);
    builtin_strncpy(local_240.items[lVar7].caption + 7,"monster",8);
    local_240.icount = local_240.icount + 1;
    lVar7 = (long)local_240.size;
    if (local_240.size <= local_240.icount) {
      local_240.size = local_240.size * 2;
      local_240.items = (nh_menuitem *)realloc(local_240.items,lVar7 * 0x218);
    }
    lVar7 = (long)local_240.icount;
    local_240.items[lVar7].id = 2;
    local_240.items[lVar7].role = MI_NORMAL;
    local_240.items[lVar7].accel = 'y';
    local_240.items[lVar7].group_accel = '\0';
    local_240.items[lVar7].selected = '\0';
    builtin_strncpy(local_240.items[lVar7].caption,"Name an individu",0x10);
    builtin_strncpy(local_240.items[lVar7].caption + 0x10,"al item",8);
    local_240.icount = local_240.icount + 1;
    lVar7 = (long)local_240.size;
    if (local_240.size <= local_240.icount) {
      local_240.size = local_240.size * 2;
      local_240.items = (nh_menuitem *)realloc(local_240.items,lVar7 * 0x218);
    }
    lVar7 = (long)local_240.icount;
    local_240.items[lVar7].id = 3;
    local_240.items[lVar7].role = MI_NORMAL;
    local_240.items[lVar7].accel = 'n';
    local_240.items[lVar7].group_accel = '\0';
    local_240.items[lVar7].selected = '\0';
    builtin_strncpy(local_240.items[lVar7].caption,"Name all items o",0x10);
    builtin_strncpy(local_240.items[lVar7].caption + 0x10,"f a certain type",0x10);
    local_240.items[lVar7].caption[0x20] = '\0';
    local_240.icount = local_240.icount + 1;
    lVar7 = (long)local_240.size;
    if (local_240.size <= local_240.icount) {
      local_240.size = local_240.size * 2;
      local_240.items = (nh_menuitem *)realloc(local_240.items,lVar7 * 0x218);
    }
    lVar7 = (long)local_240.icount;
    local_240.items[lVar7].id = 4;
    local_240.items[lVar7].role = MI_NORMAL;
    local_240.items[lVar7].accel = 'f';
    local_240.items[lVar7].group_accel = '\0';
    local_240.items[lVar7].selected = '\0';
    builtin_strncpy(local_240.items[lVar7].caption,"Annotate this le",0x10);
    builtin_strncpy(local_240.items[lVar7].caption + 0x10,"vel",4);
  }
  else {
    pcVar6 = simple_typename((int)obj->otyp);
    if (obj->quan < 2) {
      pcVar10 = "";
      if (obj->oartifact == '\x1d') {
        pcVar10 = "stack of ";
      }
    }
    else {
      pcVar10 = "stack of ";
    }
    if ((1 < obj->quan) || (obj->oartifact == '\x1d')) {
      pcVar6 = makeplural(pcVar6);
    }
    snprintf(local_128,0x80,"Name this individual %s%s?",pcVar10,pcVar6);
    lVar7 = (long)local_240.size;
    if (local_240.size <= local_240.icount) {
      local_240.size = local_240.size * 2;
      local_240.items = (nh_menuitem *)realloc(local_240.items,lVar7 * 0x218);
    }
    pnVar1 = local_240.items + local_240.icount;
    pnVar1->id = 2;
    pnVar1->role = MI_NORMAL;
    pnVar1->accel = 'y';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    if (obj->quan < 2) {
      pcVar6 = "Yes, just this item";
      if (obj->oartifact == '\x1d') {
        pcVar6 = "Yes, just this stack";
      }
    }
    else {
      pcVar6 = "Yes, just this stack";
    }
    strcpy(pnVar1->caption,pcVar6);
    local_240.icount = local_240.icount + 1;
    lVar7 = (long)local_240.size;
    if (local_240.size <= local_240.icount) {
      local_240.size = local_240.size * 2;
      local_240.items = (nh_menuitem *)realloc(local_240.items,lVar7 * 0x218);
    }
    lVar7 = (long)local_240.icount;
    local_240.items[lVar7].id = 3;
    local_240.items[lVar7].role = MI_NORMAL;
    local_240.items[lVar7].accel = 'n';
    local_240.items[lVar7].group_accel = '\0';
    local_240.items[lVar7].selected = '\0';
    builtin_strncpy(local_240.items[lVar7].caption,"No, call all ite",0x10);
    builtin_strncpy(local_240.items[lVar7].caption + 0x10,"ms of this type",0x10);
  }
  local_240.icount = local_240.icount + 1;
  if ((obj == (obj *)0x0) ||
     (pvVar8 = memchr("\t\b\v\x04\x05\r\n\x03\x06",(int)obj->oclass,10), pvVar8 != (void *)0x0)) {
    iVar4 = display_menu(local_240.items,local_240.icount,local_128,1,&local_22c);
    free(local_240.items);
    if (iVar4 == 0) {
      return 0;
    }
  }
  else {
    local_22c = 2;
    free(local_240.items);
  }
  switch(local_22c) {
  case 1:
    do_mname();
    break;
  case 2:
    if (obj == (obj *)0x0) {
      obj = getobj("\x02\x03\x04\x05\x06\a\b\t\n\v\r\x0e\x0f\x10\x11","name",(obj **)0x0);
    }
    if (obj == (obj *)0x0) {
      return 0;
    }
    pcVar6 = simple_typename((int)obj->otyp);
    if (obj->quan < 2) {
      pcVar10 = "this";
      if (obj->oartifact == '\x1d') {
        pcVar10 = "these";
      }
    }
    else {
      pcVar10 = "these";
    }
    planA = xname(obj);
    if ((1 < obj->quan) || (obj->oartifact == '\x1d')) {
      pcVar6 = makeplural(pcVar6);
    }
    if (obj->quan < 2) {
      last_resort = "thing";
      if (obj->oartifact == '\x1d') {
        last_resort = "things";
      }
    }
    else {
      last_resort = "things";
    }
    pcVar6 = safe_qbuf("",0x21,planA,pcVar6,last_resort);
    sprintf(local_a8,"What do you want to name %s %s?",pcVar10,pcVar6);
    getlin(local_a8,local_228);
    if (local_228[0] == '\0') {
      return 0;
    }
    if (local_228[0] == '\x1b') {
      return 0;
    }
    mungspaces(local_228);
    pcVar6 = artifact_name(local_228,&local_22e);
    if ((pcVar6 != (char *)0x0) && (local_22e == obj->otyp)) {
      strcpy(local_228,pcVar6);
    }
    if (obj->oartifact == '\0') {
      bVar2 = restrict_name(obj,local_228,'\0');
      if ((bVar2 != '\0') || (bVar2 = exist_artifact((int)obj->otyp,local_228), bVar2 != '\0')) {
        sVar9 = strlen(local_228);
        uVar5 = mt_random();
        lVar7 = SUB168(ZEXT416(uVar5) % SEXT816((long)(int)sVar9),0);
        cVar3 = lowc(local_228[lVar7]);
        do {
          uVar5 = mt_random();
          c = (char)uVar5 + (char)(uVar5 / 0x19) * -0x19 + 'a';
        } while (cVar3 == c);
        if (local_228[lVar7] != cVar3) {
          c = highc(c);
        }
        local_228[lVar7] = c;
        pcVar6 = body_part(6);
        pline("While engraving your %s slips.",pcVar6);
        (*windowprocs.win_pause)(P_MESSAGE);
        pline("You engrave: \"%s\".",local_228);
      }
      oname(obj,local_228);
      return 0;
    }
    pcVar6 = "The artifact seems to resist the attempt.";
    goto LAB_0017d47e;
  case 3:
    if (obj == (obj *)0x0) {
      obj = getobj("\t\b\v\x04\x05\r\n\x03\x06","call",(obj **)0x0);
    }
    if (obj == (obj *)0x0) {
      return 0;
    }
    examine_object(obj);
    if ((obj->field_0x4a & 0x20) != 0) {
      docall(obj);
      return 0;
    }
    pcVar6 = "You would never recognize another one.";
LAB_0017d47e:
    pline(pcVar6);
    break;
  case 4:
    donamelevel();
  }
  return 0;
}

Assistant:

int do_naming(struct obj *obj)
{
	int n, selected[1];
	struct menulist menu;
	char title[QBUFSZ];

	init_menulist(&menu);

	if (obj) {
	    char *otypname = simple_typename(obj->otyp);
	    snprintf(title, QBUFSZ, "Name this individual %s%s?",
		     is_plural(obj) ? "stack of " : "",
		     is_plural(obj) ? makeplural(otypname) : otypname);
	    add_menuitem(&menu, 2, is_plural(obj) ? "Yes, just this stack" :
						    "Yes, just this item",
			 'y', FALSE);
	    add_menuitem(&menu, 3, "No, call all items of this type", 'n', FALSE);
	} else {
	    snprintf(title, QBUFSZ, "What do you wish to name?");
	    add_menuitem(&menu, 1, "Name a monster", 'C', FALSE);
	    add_menuitem(&menu, 2, "Name an individual item", 'y', FALSE);
	    add_menuitem(&menu, 3, "Name all items of a certain type", 'n', FALSE);
	    add_menuitem(&menu, 4, "Annotate this level", 'f', FALSE);
	}

	if (!obj || strchr(callable, obj->oclass)) {
	    n = display_menu(menu.items, menu.icount, title, PICK_ONE, selected);
	} else {
	    /* simulate choice to name individual item automatically */
	    n = 1;
	    selected[0] = 2;	/* name one */
	}

	free(menu.items);
	if (n)
	    n = selected[0] - 1;
	else
	    return 0;

	switch (n) {
	    default: break;
	    case 0:
		do_mname();
		break;
	    case 1:
		do_oname(obj);
		break;
	    case 2:
		do_tname(obj);
		break;
	    case 3:
		donamelevel();
		break;
	}
	return 0;
}